

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  undefined8 *workSpace_00;
  undefined8 *puVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  U32 UVar14;
  size_t sVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  U32 curr;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  size_t sVar31;
  int iVar32;
  U32 nbSymbols;
  U32 tableLog;
  HUF_DTable *local_88;
  undefined8 *local_80;
  
  if (wkspSize < 0x944) {
    sVar31 = 0xffffffffffffffff;
  }
  else {
    uVar7 = *DTable;
    uVar21 = uVar7 & 0xff;
    *(undefined8 *)((long)workSpace + 0x2cc) = 0;
    *(undefined8 *)((long)workSpace + 0x2d4) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    *(undefined8 *)((long)workSpace + 0x270) = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    sVar31 = 0xffffffffffffffd4;
    if (uVar21 < 0xd) {
      workSpace_00 = (undefined8 *)((long)workSpace + 0x5dc);
      local_88 = DTable;
      local_80 = (undefined8 *)workSpace;
      sVar15 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x4dc),0x100,
                                  (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,srcSize,
                                  workSpace_00,0x368,0);
      sVar31 = sVar15;
      if ((sVar15 < 0xffffffffffffff89) &&
         (iVar18 = uVar21 - tableLog, sVar31 = 0xffffffffffffffd4, tableLog <= uVar21)) {
        uVar23 = 0;
        UVar14 = tableLog;
        do {
          uVar20 = (ulong)UVar14;
          UVar14 = UVar14 - 1;
          uVar23 = uVar23 + 1;
        } while (((U32 *)((long)workSpace + 0x270))[uVar20] == 0);
        uVar20 = (ulong)((tableLog - uVar23) + 2);
        uVar24 = 0;
        for (lVar22 = 0x9d; lVar22 - 0x9cU < uVar20; lVar22 = lVar22 + 1) {
          iVar27 = *(int *)((long)local_80 + lVar22 * 4);
          *(uint *)((long)local_80 + lVar22 * 4 + 0x38) = uVar24;
          uVar24 = iVar27 + uVar24;
        }
        *(uint *)(local_80 + 0x55) = uVar24;
        for (uVar28 = 0; nbSymbols != uVar28; uVar28 = uVar28 + 1) {
          bVar16 = *(byte *)((long)local_80 + uVar28 + 0x4dc);
          uVar19 = *(uint *)((long)local_80 + (ulong)bVar16 * 4 + 0x2a8);
          *(uint *)((long)local_80 + (ulong)bVar16 * 4 + 0x2a8) = uVar19 + 1;
          *(char *)((long)local_80 + (ulong)uVar19 * 2 + 0x2dc) = (char)uVar28;
          *(byte *)((long)local_80 + (ulong)uVar19 * 2 + 0x2dd) = bVar16;
        }
        *(undefined4 *)(local_80 + 0x55) = 0;
        iVar27 = 0;
        for (uVar28 = 1; uVar28 < uVar20; uVar28 = uVar28 + 1) {
          iVar32 = *(int *)((long)local_80 + uVar28 * 4 + 0x270);
          bVar16 = (byte)iVar18;
          *(int *)((long)local_80 + uVar28 * 4) = iVar27;
          iVar18 = iVar18 + 1;
          iVar27 = (iVar32 << (bVar16 & 0x1f)) + iVar27;
        }
        iVar18 = tableLog + 1;
        lVar22 = (ulong)uVar23 * 0x34;
        for (uVar19 = uVar23; uVar28 = 1, uVar19 < (uVar21 - uVar23) + 1; uVar19 = uVar19 + 1) {
          for (; uVar28 < uVar20; uVar28 = uVar28 + 1) {
            *(uint *)((long)local_80 + uVar28 * 4 + lVar22) =
                 *(uint *)((long)local_80 + uVar28 * 4) >> ((byte)uVar19 & 0x1f);
          }
          lVar22 = lVar22 + 0x34;
        }
        puVar1 = local_80 + 0xc2;
        *(undefined4 *)((long)workSpace + 0x60c) = *(undefined4 *)(local_80 + 6);
        uVar9 = *local_80;
        uVar10 = local_80[1];
        uVar11 = local_80[2];
        uVar12 = local_80[3];
        uVar13 = local_80[5];
        *(undefined8 *)((long)workSpace + 0x5fc) = local_80[4];
        *(undefined8 *)((long)workSpace + 0x604) = uVar13;
        *(undefined8 *)((long)workSpace + 0x5ec) = uVar11;
        *(undefined8 *)((long)workSpace + 0x5f4) = uVar12;
        *workSpace_00 = uVar9;
        *(undefined8 *)((long)workSpace + 0x5e4) = uVar10;
        for (uVar20 = 0; uVar20 != uVar24; uVar20 = uVar20 + 1) {
          bVar16 = *(byte *)((long)local_80 + uVar20 * 2 + 0x2dc);
          bVar4 = *(byte *)((long)local_80 + uVar20 * 2 + 0x2dd);
          uVar25 = iVar18 - (uint)bVar4;
          uVar19 = *(uint *)((long)workSpace_00 + (ulong)bVar4 * 4);
          uVar28 = (ulong)uVar19;
          bVar17 = (byte)(uVar21 - uVar25);
          iVar27 = 1 << (bVar17 & 0x1f);
          if (uVar21 - uVar25 < uVar23) {
            for (; uVar28 < iVar27 + uVar19; uVar28 = uVar28 + 1) {
              local_88[uVar28 + 1] = (uVar25 & 0xff) * 0x10000 + (uint)bVar16 + 0x1000000;
            }
          }
          else {
            uVar29 = (iVar18 - uVar21) + uVar25;
            uVar19 = 1;
            if (1 < (int)uVar29) {
              uVar19 = uVar29;
            }
            uVar8 = *(uint *)((long)local_80 + (ulong)uVar19 * 4 + 0x2a4);
            lVar22 = (ulong)uVar25 * 0x34;
            *(undefined4 *)(local_80 + 200) = *(undefined4 *)((long)local_80 + lVar22 + 0x30);
            uVar9 = *(undefined8 *)((long)local_80 + lVar22);
            uVar10 = ((undefined8 *)((long)local_80 + lVar22))[1];
            puVar3 = (undefined8 *)((long)local_80 + lVar22 + 0x10);
            uVar11 = *puVar3;
            uVar12 = puVar3[1];
            puVar3 = (undefined8 *)((long)local_80 + lVar22 + 0x20);
            uVar13 = puVar3[1];
            local_80[0xc6] = *puVar3;
            local_80[199] = uVar13;
            local_80[0xc4] = uVar11;
            local_80[0xc5] = uVar12;
            *puVar1 = uVar9;
            local_80[0xc3] = uVar10;
            if (1 < (int)uVar29) {
              uVar19 = *(uint *)((long)puVar1 + (ulong)uVar19 * 4);
              for (uVar30 = 0; uVar19 != uVar30; uVar30 = uVar30 + 1) {
                local_88[uVar28 + uVar30 + 1] = (uVar25 & 0xff) * 0x10000 + (uint)bVar16 + 0x1000000
                ;
              }
            }
            lVar22 = (ulong)uVar8 * 2;
            for (uVar30 = 0; uVar30 != uVar24 - uVar8; uVar30 = uVar30 + 1) {
              bVar5 = *(byte *)((long)local_80 + uVar30 * 2 + lVar22 + 0x2dc);
              bVar6 = *(byte *)((long)local_80 + uVar30 * 2 + lVar22 + 0x2dd);
              iVar32 = 1 << (bVar17 - (char)(iVar18 - (uint)bVar6) & 0x1f);
              uVar29 = *(uint *)((long)puVar1 + (ulong)bVar6 * 4);
              uVar19 = uVar29 + iVar32;
              do {
                uVar26 = (ulong)uVar29;
                uVar29 = uVar29 + 1;
                local_88[uVar28 + uVar26 + 1] =
                     (uint)bVar16 +
                     (((iVar18 - (uint)bVar6) + uVar25 & 0xff) << 0x10 | (uint)bVar5 << 8) +
                     0x2000000;
              } while (uVar29 < uVar19);
              piVar2 = (int *)((long)puVar1 + (ulong)bVar6 * 4);
              *piVar2 = *piVar2 + iVar32;
            }
          }
          piVar2 = (int *)((long)workSpace_00 + (ulong)bVar4 * 4);
          *piVar2 = *piVar2 + iVar27;
        }
        *(char *)local_88 = (char)uVar7;
        *(undefined1 *)((long)local_88 + 1) = 1;
        *(char *)((long)local_88 + 2) = (char)uVar7;
        *(char *)((long)local_88 + 3) = (char)(uVar7 >> 0x18);
        sVar31 = sVar15;
      }
    }
  }
  return sVar31;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), /* bmi2 */ 0);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
            wksp->sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol, sizeOfSort,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1,
                   wksp->calleeWksp, sizeof(wksp->calleeWksp) / sizeof(U32));

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}